

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O0

int Io_WriteMoPlaOneInt(FILE *pFile,Abc_Ntk_t *pNtk,DdManager *dd,Vec_Ptr_t *vFuncs)

{
  bool bVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  char *pcVar9;
  int nCubes1;
  int nCubes0;
  DdNode *zCover1;
  DdNode *zCover0;
  DdNode *bCover;
  int fPhase;
  int nCubes;
  int nOutputs;
  int nInputs;
  int k;
  int i;
  DdNode *zCover;
  DdNode *bTemp;
  DdNode *bFunc;
  DdNode *bCube;
  DdNode *bOffset;
  DdNode *bOnset;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vFuncs_local;
  DdManager *dd_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  pNode = (Abc_Obj_t *)vFuncs;
  vFuncs_local = (Vec_Ptr_t *)dd;
  dd_local = (DdManager *)pNtk;
  pNtk_local = (Abc_Ntk_t *)pFile;
  iVar4 = Vec_PtrSize(vFuncs);
  iVar5 = Abc_NtkCoNum((Abc_Ntk_t *)dd_local);
  if (iVar4 != iVar5) {
    __assert_fail("Vec_PtrSize(vFuncs) == Abc_NtkCoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                  ,0xd9,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  iVar4 = *(int *)&vFuncs_local[8].pArray;
  iVar5 = Abc_NtkCiNum((Abc_Ntk_t *)dd_local);
  if (iVar4 != iVar5) {
    __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                  ,0xda,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  if (1000 < *(int *)&vFuncs_local[8].pArray) {
    __assert_fail("dd->size <= 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                  ,0xdb,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  nCubes = Abc_NtkCiNum((Abc_Ntk_t *)dd_local);
  fPhase = Abc_NtkCoNum((Abc_Ntk_t *)dd_local);
  if (fPhase < 2) {
    __assert_fail("nOutputs > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                  ,0xe0,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  for (nInputs = 0; nInputs < fPhase; nInputs = nInputs + 1) {
    Cudd_bddNewVarAtLevel((DdManager *)vFuncs_local,nInputs);
  }
  if (*(int *)&vFuncs_local[8].pArray != nCubes + fPhase) {
    __assert_fail("dd->size == nInputs + nOutputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                  ,0xe5,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  bOffset = Cudd_ReadLogicZero((DdManager *)vFuncs_local);
  Cudd_Ref(bOffset);
  bCube = Cudd_ReadLogicZero((DdManager *)vFuncs_local);
  Cudd_Ref(bCube);
  for (nInputs = 0; nInputs < fPhase; nInputs = nInputs + 1) {
    bTemp = (DdNode *)Vec_PtrEntry((Vec_Ptr_t *)pNode,nInputs);
    pVVar2 = vFuncs_local;
    pDVar7 = Cudd_bddIthVar((DdManager *)vFuncs_local,nCubes + nInputs);
    bFunc = Cudd_bddAnd((DdManager *)pVVar2,pDVar7,bTemp);
    Cudd_Ref(bFunc);
    for (nOutputs = 0; pVVar2 = vFuncs_local, pDVar7 = bFunc, nOutputs < fPhase;
        nOutputs = nOutputs + 1) {
      if (nOutputs != nInputs) {
        zCover = bFunc;
        pDVar8 = Cudd_bddIthVar((DdManager *)vFuncs_local,nCubes + nOutputs);
        bFunc = Cudd_bddAnd((DdManager *)pVVar2,pDVar7,(DdNode *)((ulong)pDVar8 ^ 1));
        Cudd_Ref(bFunc);
        Cudd_RecursiveDeref((DdManager *)vFuncs_local,zCover);
      }
    }
    zCover = bOffset;
    bOffset = Cudd_bddOr((DdManager *)vFuncs_local,bOffset,bFunc);
    Cudd_Ref(bOffset);
    Cudd_RecursiveDeref((DdManager *)vFuncs_local,zCover);
    Cudd_RecursiveDeref((DdManager *)vFuncs_local,bFunc);
    pVVar2 = vFuncs_local;
    pDVar7 = Cudd_bddIthVar((DdManager *)vFuncs_local,nCubes + nInputs);
    bFunc = Cudd_bddAnd((DdManager *)pVVar2,pDVar7,(DdNode *)((ulong)bTemp ^ 1));
    Cudd_Ref(bFunc);
    zCover = bCube;
    bCube = Cudd_bddOr((DdManager *)vFuncs_local,bCube,bFunc);
    Cudd_Ref(bCube);
    Cudd_RecursiveDeref((DdManager *)vFuncs_local,zCover);
    Cudd_RecursiveDeref((DdManager *)vFuncs_local,bFunc);
    printf("Trying %d output.\n",(ulong)(uint)nInputs);
    uVar6 = Cudd_DagSize(bOffset);
    printf("Onset = %d nodes.\n",(ulong)uVar6);
    uVar6 = Cudd_DagSize(bCube);
    printf("Offset = %d nodes.\n",(ulong)uVar6);
  }
  Cudd_zddVarsFromBddVars((DdManager *)vFuncs_local,2);
  zCover0 = Cudd_zddIsop((DdManager *)vFuncs_local,bCube,(DdNode *)((ulong)bOffset ^ 1),&zCover1);
  Cudd_Ref(zCover1);
  Cudd_Ref(zCover0);
  Cudd_RecursiveDeref((DdManager *)vFuncs_local,zCover0);
  uVar6 = Abc_CountZddCubes((DdManager *)vFuncs_local,zCover1);
  zCover0 = Cudd_zddIsop((DdManager *)vFuncs_local,bOffset,(DdNode *)((ulong)bCube ^ 1),
                         (DdNode **)&nCubes1);
  Cudd_Ref(_nCubes1);
  Cudd_Ref(zCover0);
  Cudd_RecursiveDeref((DdManager *)vFuncs_local,zCover0);
  bCover._4_4_ = Abc_CountZddCubes((DdManager *)vFuncs_local,_nCubes1);
  bVar1 = (int)uVar6 < (int)bCover._4_4_;
  if (bVar1) {
    _k = zCover1;
    bCover._4_4_ = uVar6;
    Cudd_RecursiveDerefZdd((DdManager *)vFuncs_local,_nCubes1);
  }
  else {
    _k = _nCubes1;
    Cudd_RecursiveDerefZdd((DdManager *)vFuncs_local,zCover1);
  }
  bCover._0_4_ = (uint)!bVar1;
  Cudd_RecursiveDeref((DdManager *)vFuncs_local,bOffset);
  Cudd_RecursiveDeref((DdManager *)vFuncs_local,bCube);
  Cudd_RecursiveDerefZdd((DdManager *)vFuncs_local,_k);
  uVar6 = Cudd_DagSize(_k);
  printf("Cover = %d nodes.\n",(ulong)uVar6);
  printf("ISOP = %d\n",(ulong)bCover._4_4_);
  fprintf((FILE *)pNtk_local,".i %d\n",(ulong)(uint)nCubes);
  fprintf((FILE *)pNtk_local,".o %d\n",(ulong)(uint)fPhase);
  fprintf((FILE *)pNtk_local,".ilb");
  for (nInputs = 0; iVar4 = nInputs, iVar5 = Abc_NtkCiNum((Abc_Ntk_t *)dd_local), iVar4 < iVar5;
      nInputs = nInputs + 1) {
    bOnset = (DdNode *)Abc_NtkCi((Abc_Ntk_t *)dd_local,nInputs);
    pAVar3 = pNtk_local;
    pcVar9 = Abc_ObjName((Abc_Obj_t *)bOnset);
    fprintf((FILE *)pAVar3," %s",pcVar9);
  }
  fprintf((FILE *)pNtk_local,"\n");
  fprintf((FILE *)pNtk_local,".ob");
  for (nInputs = 0; iVar4 = nInputs, iVar5 = Abc_NtkCoNum((Abc_Ntk_t *)dd_local), iVar4 < iVar5;
      nInputs = nInputs + 1) {
    bOnset = (DdNode *)Abc_NtkCo((Abc_Ntk_t *)dd_local,nInputs);
    pAVar3 = pNtk_local;
    pcVar9 = Abc_ObjName((Abc_Obj_t *)bOnset);
    fprintf((FILE *)pAVar3," %s",pcVar9);
  }
  fprintf((FILE *)pNtk_local,"\n");
  fprintf((FILE *)pNtk_local,".p %d\n",(ulong)bCover._4_4_);
  fprintf((FILE *)pNtk_local,".e\n");
  return 1;
}

Assistant:

int Io_WriteMoPlaOneInt( FILE * pFile, Abc_Ntk_t * pNtk, DdManager * dd, Vec_Ptr_t * vFuncs )
{
    Abc_Obj_t * pNode;
    DdNode * bOnset, * bOffset, * bCube, * bFunc, * bTemp, * zCover;
    int i, k, nInputs, nOutputs;
    int nCubes, fPhase;

    assert( Vec_PtrSize(vFuncs) == Abc_NtkCoNum(pNtk) );
    assert( dd->size == Abc_NtkCiNum(pNtk) );
    assert( dd->size <= 1000 );

    // collect the parameters
    nInputs   = Abc_NtkCiNum(pNtk);
    nOutputs  = Abc_NtkCoNum(pNtk);
    assert( nOutputs > 1 );

    // create extra variables
    for ( i = 0; i < nOutputs; i++ )
        Cudd_bddNewVarAtLevel( dd, i );
    assert( dd->size == nInputs + nOutputs );

    // create ON and OFF sets
    bOnset = Cudd_ReadLogicZero( dd );  Cudd_Ref(bOnset);
    bOffset = Cudd_ReadLogicZero( dd ); Cudd_Ref(bOffset);
    for ( i = 0; i < nOutputs; i++ )
    {
        bFunc = (DdNode *)Vec_PtrEntry(vFuncs, i);
        // create onset
        bCube = Cudd_bddAnd( dd, Cudd_bddIthVar(dd, nInputs+i), bFunc );  Cudd_Ref(bCube);
        for ( k = 0; k < nOutputs; k++ ) 
            if ( k != i )
            {
                bCube = Cudd_bddAnd( dd, bTemp = bCube, Cudd_Not(Cudd_bddIthVar(dd, nInputs+k)) );  Cudd_Ref(bCube);
                Cudd_RecursiveDeref( dd, bTemp );
            }
        bOnset = Cudd_bddOr( dd, bTemp = bOnset, bCube );   Cudd_Ref(bOnset);
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        // create offset
        bCube = Cudd_bddAnd( dd, Cudd_bddIthVar(dd, nInputs+i), Cudd_Not(bFunc) );  Cudd_Ref(bCube);
        bOffset = Cudd_bddOr( dd, bTemp = bOffset, bCube );                         Cudd_Ref(bOffset);
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );

        printf( "Trying %d output.\n", i );
        printf( "Onset = %d nodes.\n", Cudd_DagSize(bOnset) );
        printf( "Offset = %d nodes.\n", Cudd_DagSize(bOffset) );
    }

    Cudd_zddVarsFromBddVars( dd, 2 );

    // derive ISOP
    {
        extern int Abc_CountZddCubes( DdManager * dd, DdNode * zCover );
        DdNode * bCover, * zCover0, * zCover1;
        int nCubes0, nCubes1;
        // get the ZDD of the negative polarity
        bCover = Cudd_zddIsop( dd, bOffset, Cudd_Not(bOnset), &zCover0 );
        Cudd_Ref( zCover0 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes0 = Abc_CountZddCubes( dd, zCover0 );

        // get the ZDD of the positive polarity
        bCover = Cudd_zddIsop( dd, bOnset, Cudd_Not(bOffset), &zCover1 );
        Cudd_Ref( zCover1 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes1 = Abc_CountZddCubes( dd, zCover1 );

        // compare the number of cubes
        if ( nCubes1 <= nCubes0 )
        { // use positive polarity
            nCubes = nCubes1;
            zCover = zCover1;
            Cudd_RecursiveDerefZdd( dd, zCover0 );
            fPhase = 1;
        }
        else
        { // use negative polarity
            nCubes = nCubes0;
            zCover = zCover0;
            Cudd_RecursiveDerefZdd( dd, zCover1 );
            fPhase = 0;
        }
    }
    Cudd_RecursiveDeref( dd, bOnset );
    Cudd_RecursiveDeref( dd, bOffset );
    Cudd_RecursiveDerefZdd( dd, zCover );
    printf( "Cover = %d nodes.\n", Cudd_DagSize(zCover) );
    printf( "ISOP = %d\n", nCubes );

    // write the header
    fprintf( pFile, ".i %d\n", nInputs );
    fprintf( pFile, ".o %d\n", nOutputs );
    fprintf( pFile, ".ilb" );
    Abc_NtkForEachCi( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".ob" );
    Abc_NtkForEachCo( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".p %d\n", nCubes );


    fprintf( pFile, ".e\n" );
    return 1;
}